

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O3

int lj_cf_os_exit(lua_State *L)

{
  uint __status;
  TValue *pTVar1;
  TValue *pTVar2;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  if ((pTVar1 < pTVar2) && ((pTVar1->field_2).it + 3 < 2)) {
    __status = (uint)((pTVar1->field_2).it == 0xfffffffe);
  }
  else {
    __status = lj_lib_optint(L,1,0);
    pTVar1 = L->base;
    pTVar2 = L->top;
  }
  if ((pTVar1 + 1 < pTVar2) && (*(uint *)((long)pTVar1 + 0xc) < 0xfffffffe)) {
    lua_close(L);
  }
  exit(__status);
}

Assistant:

LJLIB_CF(os_exit)
{
  int status;
  if (L->base < L->top && tvisbool(L->base))
    status = boolV(L->base) ? EXIT_SUCCESS : EXIT_FAILURE;
  else
    status = lj_lib_optint(L, 1, EXIT_SUCCESS);
  if (L->base+1 < L->top && tvistruecond(L->base+1))
    lua_close(L);
  exit(status);
  return 0;  /* Unreachable. */
}